

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaFadds.c
# Opt level: O0

int Gia_ObjFanin0CopyCarry(Vec_Int_t *vCarries,Gia_Obj_t *pObj,int Id)

{
  int iVar1;
  int c;
  int Id_local;
  Gia_Obj_t *pObj_local;
  Vec_Int_t *vCarries_local;
  
  if (vCarries != (Vec_Int_t *)0x0) {
    iVar1 = Gia_ObjFaninId0(pObj,Id);
    iVar1 = Vec_IntEntry(vCarries,iVar1);
    if (iVar1 != -1) {
      iVar1 = Gia_ObjFaninId0(pObj,Id);
      iVar1 = Vec_IntEntry(vCarries,iVar1);
      c = Gia_ObjFaninC0(pObj);
      iVar1 = Abc_LitNotCond(iVar1,c);
      return iVar1;
    }
  }
  iVar1 = Gia_ObjFanin0Copy(pObj);
  return iVar1;
}

Assistant:

int Gia_ObjFanin0CopyCarry( Vec_Int_t * vCarries, Gia_Obj_t * pObj, int Id )
{
    if ( vCarries == NULL || Vec_IntEntry(vCarries, Gia_ObjFaninId0(pObj, Id)) == -1 )
        return Gia_ObjFanin0Copy(pObj);
    return Abc_LitNotCond( Vec_IntEntry(vCarries, Gia_ObjFaninId0(pObj, Id)), Gia_ObjFaninC0(pObj) );
}